

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

void __thiscall
stream::slice_reader::slice_reader
          (slice_reader *this,path_type *dirname,string *basename,string *basename2,
          size_t disk_slice_count)

{
  pointer pcVar1;
  
  this->data_offset = 0;
  (this->dir).m_pathname._M_dataplus._M_p = (pointer)&(this->dir).m_pathname.field_2;
  pcVar1 = (dirname->m_pathname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dir,pcVar1,pcVar1 + (dirname->m_pathname)._M_string_length);
  (this->base_file)._M_dataplus._M_p = (pointer)&(this->base_file).field_2;
  pcVar1 = (basename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->base_file,pcVar1,pcVar1 + basename->_M_string_length);
  (this->base_file2)._M_dataplus._M_p = (pointer)&(this->base_file2).field_2;
  pcVar1 = (basename2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->base_file2,pcVar1,pcVar1 + basename2->_M_string_length);
  this->slices_per_disk = disk_slice_count;
  this->current_slice = 0;
  this->slice_size = 0;
  boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream(&this->ifs);
  this->is = (istream *)&this->ifs;
  return;
}

Assistant:

slice_reader::slice_reader(const path_type & dirname, const std::string & basename,
                           const std::string & basename2, size_t disk_slice_count)
	: data_offset(0),
	  dir(dirname), base_file(basename), base_file2(basename2),
	  slices_per_disk(disk_slice_count), current_slice(0), slice_size(0),
	  is(&ifs) { }